

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::LogicalType>
          (Deserializer *this,field_id_t field_id,char *tag,LogicalType *ret)

{
  Deserializer *in_RDX;
  undefined2 in_SI;
  LogicalType *in_RDI;
  LogicalType *in_stack_ffffffffffffffb8;
  LogicalType local_38 [32];
  
  (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,in_SI,in_RDX,in_SI);
  Read<duckdb::LogicalType>(in_RDX);
  LogicalType::operator=(in_RDI,in_stack_ffffffffffffffb8);
  duckdb::LogicalType::~LogicalType(local_38);
  (**(code **)(*(long *)in_RDI + 0x18))();
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}